

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

bool __thiscall CUI::DoButtonLogic(CUI *this,void *pID,CUIRect *pRect,int Button)

{
  bool bVar1;
  bool bVar2;
  CUI *pCVar3;
  int in_ECX;
  CUIRect *in_RDX;
  CUI *in_RSI;
  CUI *in_RDI;
  bool Hovered;
  bool Clicked;
  bool local_1d;
  
  local_1d = false;
  bVar1 = MouseHovered(in_RSI,in_RDX);
  bVar2 = CheckActiveItem(in_RDI,in_RSI);
  if (bVar2) {
    if ((DoButtonLogic::s_LastButton == in_ECX) &&
       (bVar2 = MouseButton(in_RDI,DoButtonLogic::s_LastButton), !bVar2)) {
      SetActiveItem(in_RDI,(void *)0x0);
      DoButtonLogic::s_LastButton = -1;
      local_1d = bVar1;
    }
  }
  else {
    pCVar3 = (CUI *)HotItem(in_RDI);
    if ((pCVar3 == in_RSI) && (bVar2 = MouseButton(in_RDI,in_ECX), bVar2)) {
      SetActiveItem(in_RDI,in_RSI);
      DoButtonLogic::s_LastButton = in_ECX;
    }
  }
  if ((bVar1) && (bVar1 = MouseButton(in_RDI,in_ECX), !bVar1)) {
    SetHotItem(in_RDI,in_RSI);
  }
  return local_1d;
}

Assistant:

bool CUI::DoButtonLogic(const void *pID, const CUIRect *pRect, int Button)
{
	// logic
	bool Clicked = false;
	static int s_LastButton = -1;
	const bool Hovered = MouseHovered(pRect);

	if(CheckActiveItem(pID))
	{
		if(s_LastButton == Button && !MouseButton(s_LastButton))
		{
			if(Hovered)
				Clicked = true;
			SetActiveItem(0);
			s_LastButton = -1;
		}
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(Button))
		{
			SetActiveItem(pID);
			s_LastButton = Button;
		}
	}

	if(Hovered && !MouseButton(Button))
		SetHotItem(pID);

	return Clicked;
}